

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::LocalAppend
          (DataTable *this,LocalAppendState *state,ClientContext *context,DataChunk *chunk,
          bool unsafe)

{
  type constraint_state;
  TransactionException *this_00;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  if (chunk->count == 0) {
    return;
  }
  if ((this->version)._M_i == MAIN_TABLE) {
    DataChunk::Verify(chunk);
    if (!unsafe) {
      constraint_state =
           unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>::
           operator*(&state->constraint_state);
      VerifyAppendConstraints
                (this,constraint_state,context,chunk,state->storage,
                 (optional_ptr<duckdb::ConflictManager,_true>)0x0);
    }
    LocalStorage::Append(state,chunk);
    return;
  }
  this_00 = (TransactionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Transaction conflict: attempting to insert into table \"%s\" but it has been %s by a different transaction"
             ,&local_89);
  GetTableName_abi_cxx11_(&local_68,this);
  TableModification_abi_cxx11_(&local_88,this);
  TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_48,&local_68,&local_88);
  __cxa_throw(this_00,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::LocalAppend(LocalAppendState &state, ClientContext &context, DataChunk &chunk, bool unsafe) {
	if (chunk.size() == 0) {
		return;
	}
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to insert into table \"%s\" but it has been %s by "
		                           "a different transaction",
		                           GetTableName(), TableModification());
	}
	chunk.Verify();

	// Insert any row ids into the DELETE ART and verify constraints afterward.
	// This happens only for the global indexes.
	if (!unsafe) {
		auto &constraint_state = *state.constraint_state;
		VerifyAppendConstraints(constraint_state, context, chunk, *state.storage, nullptr);
	}

	// Append to the transaction-local data.
	LocalStorage::Append(state, chunk);
}